

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *o,Molecule *mol)

{
  ostream *poVar1;
  
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + (char)o);
  std::ostream::put((char)o);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o,"Molecule ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)o,mol->globalIndex_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"has: ",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," atoms",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bonds",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bends",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," torsions",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," inversions",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," rigid bodies",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," integrable objects",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," cutoff groups",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," constraint pairs",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," fluctuating charges",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Molecule& mol) {
    o << std::endl;
    o << "Molecule " << mol.getGlobalIndex() << "has: " << std::endl;
    o << mol.getNAtoms() << " atoms" << std::endl;
    o << mol.getNBonds() << " bonds" << std::endl;
    o << mol.getNBends() << " bends" << std::endl;
    o << mol.getNTorsions() << " torsions" << std::endl;
    o << mol.getNInversions() << " inversions" << std::endl;
    o << mol.getNRigidBodies() << " rigid bodies" << std::endl;
    o << mol.getNIntegrableObjects() << " integrable objects" << std::endl;
    o << mol.getNCutoffGroups() << " cutoff groups" << std::endl;
    o << mol.getNConstraintPairs() << " constraint pairs" << std::endl;
    o << mol.getNFluctuatingCharges() << " fluctuating charges" << std::endl;
    return o;
  }